

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  ValidateOptions *options;
  string *psVar1;
  string *header;
  WastParseOptions *options_00;
  OutputBuffer *this;
  pointer start;
  pointer puVar2;
  code *pcVar3;
  _Head_base<0UL,_wabt::LexerSource_*,_false> line_finder;
  pointer pcVar4;
  void *pvVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  Result RVar8;
  wabt *pwVar9;
  size_t sVar10;
  Callback *callback;
  char *extraout_RDX;
  size_t *unaff_RBX;
  uint uVar11;
  ulong unaff_RBP;
  undefined1 *puVar12;
  size_type __rlen;
  pointer unaff_R13;
  undefined8 *unaff_R14;
  char *unaff_R15;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view sVar13;
  string result;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  Errors errors;
  OptionParser parser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastParseOptions parse_wast_options;
  
  puVar12 = (undefined1 *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(char **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(undefined8 **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(pointer *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(size_type *)((long)register0x00000020 + -0x28) = __rlen;
    *(size_t **)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d467;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d482;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0xf8),"wat2wasm",
               "  read a file in the wasm text format, check it for errors, and\n  convert it to the wasm binary format.\n\nexamples:\n  # parse test.wat and write to .wasm binary file with the same name\n  $ wat2wasm test.wat\n\n  # parse test.wat and write to binary file test.wasm\n  $ wat2wasm test.wat -o test.wasm\n\n  # parse spec-test.wast, and write verbose output to stdout (including\n  # the meaning of every byte)\n  $ wat2wasm spec-test.wast -v\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:70:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:70:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d4c2;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d4da;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:75:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:75:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d517;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),"debug-parser",
               "Turn on debugging the parser of wat files",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d52f;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:78:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:78:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d571;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),'d',"dump-module",
               "Print a hexdump of the module to stdout",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d589;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d59d;
    wabt::Features::AddOptions(&s_features,(OptionParser *)((long)register0x00000020 + -0xf8));
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:82:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:82:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d5e4;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),'o',"output","FILE",
               "Output wasm binary file. Use \"-\" to write to stdout.",
               (Callback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d5fc;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:86:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:86:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d63e;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),'r',"relocatable",
               "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d656;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:90:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:90:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d693;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),"no-canonicalize-leb128s",
               "Write all LEB128 sizes as 5-bytes instead of their minimal size",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d6ab;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:93:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:93:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d6e8;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),"debug-names",
               "Write debug names to the generated binary file",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d700;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x148))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(code **)((long)register0x00000020 + -0x130) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:95:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x138) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:95:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d73d;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xf8),"no-check",
               "Don\'t check for invalid modules",
               (NullCallback *)((long)register0x00000020 + -0x148));
    if (*(code **)((long)register0x00000020 + -0x138) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d755;
      (**(code **)((long)register0x00000020 + -0x138))
                ((undefined1 *)((long)register0x00000020 + -0x148),
                 (undefined1 *)((long)register0x00000020 + -0x148),3);
    }
    __rlen = (long)register0x00000020 + -0x138;
    *(size_type *)((long)register0x00000020 + -0x148) = __rlen;
    *(undefined8 *)__rlen = 0x656d616e656c6966;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 8;
    *(undefined1 *)((long)register0x00000020 + -0x130) = 0;
    callback = (Callback *)((long)register0x00000020 + -0x68);
    *(undefined8 *)&(callback->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x60) = 0;
    *(code **)((long)register0x00000020 + -0x50) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:97:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x58) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wat2wasm.cc:97:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d7b5;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0xf8),
               (string *)((long)register0x00000020 + -0x148),One,callback);
    if (*(code **)((long)register0x00000020 + -0x58) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d7d0;
      (**(code **)((long)register0x00000020 + -0x58))
                ((undefined1 *)((long)register0x00000020 + -0x68),
                 (undefined1 *)((long)register0x00000020 + -0x68),3);
    }
    if (*(undefined8 **)((long)register0x00000020 + -0x148) != (undefined8 *)__rlen) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d7e7;
      operator_delete(*(undefined8 **)((long)register0x00000020 + -0x148),
                      *(long *)((long)register0x00000020 + -0x138) + 1);
    }
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d7f9;
    wabt::OptionParser::Parse((OptionParser *)((long)register0x00000020 + -0xf8),(int)puVar12,argv);
    if (*(code **)((long)register0x00000020 + -0x78) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d817;
      (**(code **)((long)register0x00000020 + -0x78))
                ((undefined1 *)((long)register0x00000020 + -0x88),
                 (undefined1 *)((long)register0x00000020 + -0x88),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d824;
    std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
    ~vector((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
            ((long)register0x00000020 + -0xa0));
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d834;
    std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
              ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
               ((long)register0x00000020 + -0xb8));
    if (*(undefined1 **)((long)register0x00000020 + -0xd8) !=
        (undefined1 *)((long)register0x00000020 + -200)) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d855;
      operator_delete(*(undefined1 **)((long)register0x00000020 + -0xd8),
                      *(long *)((long)register0x00000020 + -200) + 1);
    }
    unaff_R13 = (pointer)((long)register0x00000020 + -0xe8);
    if (*(pointer *)((long)register0x00000020 + -0xf8) != unaff_R13) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d870;
      operator_delete(*(pointer *)((long)register0x00000020 + -0xf8),
                      *(long *)((long)register0x00000020 + -0xe8) + 1);
    }
    pcVar7 = s_infile;
    unaff_RBX = (size_t *)((long)register0x00000020 + -0x68);
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0;
    *unaff_RBX = 0;
    *(undefined8 *)((long)register0x00000020 + -0x60) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d894;
    pwVar9 = (wabt *)strlen(s_infile);
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d8a2;
    sVar13._M_str = (char *)unaff_RBX;
    sVar13._M_len = (size_t)pcVar7;
    RVar8 = wabt::ReadFile(pwVar9,sVar13,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    unaff_R15 = s_infile;
    unaff_RBP = (ulong)RVar8.enum_;
    unaff_R14 = (undefined8 *)((long)register0x00000020 + -0x118);
    *(undefined8 *)((long)register0x00000020 + -0x108) = 0;
    *unaff_R14 = 0;
    *(undefined8 *)((long)register0x00000020 + -0x110) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d8c3;
    argv = (char **)strlen(s_infile);
    puVar12 = (undefined1 *)((long)register0x00000020 + -0x128);
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d8e0;
    filename_02._M_str = (char *)argv;
    filename_02._M_len = (size_t)puVar12;
    wabt::WastLexer::CreateBufferLexer
              (filename_02,unaff_R15,*unaff_RBX,
               (Errors *)(*(long *)((long)register0x00000020 + -0x60) - *unaff_RBX));
    if (RVar8.enum_ != Error) break;
    *(code **)((long)register0x00000020 + -0x160) = main;
    ProgramMain();
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x158);
  }
  (((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
   ((long)register0x00000020 + -0x120))->_M_t).
  super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl = (Module *)0x0;
  options_00 = (WastParseOptions *)((long)register0x00000020 + -0x48);
  *(undefined4 *)((long)register0x00000020 + -0x39) = s_features._15_4_;
  (options_00->features).exceptions_enabled_ = s_features.exceptions_enabled_;
  (options_00->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  (options_00->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  (options_00->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
  (options_00->features).simd_enabled_ = s_features.simd_enabled_;
  (options_00->features).threads_enabled_ = s_features.threads_enabled_;
  (options_00->features).function_references_enabled_ = s_features.function_references_enabled_;
  (options_00->features).multi_value_enabled_ = s_features.multi_value_enabled_;
  *(ulong *)((long)register0x00000020 + -0x40) =
       CONCAT17(s_features.multi_memory_enabled_,s_features._8_7_);
  *(undefined2 *)((long)register0x00000020 + -0x35) = 0x100;
  *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d925;
  RVar8 = wabt::ParseWatModule
                    (*(WastLexer **)((long)register0x00000020 + -0x128),
                     (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                     ((long)register0x00000020 + -0x120),
                     (Errors *)((long)register0x00000020 + -0x118),options_00);
  uVar11 = 1;
  if (RVar8.enum_ == Ok) {
    if (s_validate == '\0') {
      options = (ValidateOptions *)((long)register0x00000020 + -0xf8);
      *(undefined4 *)((long)register0x00000020 + -0xe9) = s_features._15_4_;
      (options->features).exceptions_enabled_ = s_features.exceptions_enabled_;
      (options->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      (options->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      (options->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
      (options->features).simd_enabled_ = s_features.simd_enabled_;
      (options->features).threads_enabled_ = s_features.threads_enabled_;
      (options->features).function_references_enabled_ = s_features.function_references_enabled_;
      (options->features).multi_value_enabled_ = s_features.multi_value_enabled_;
      *(ulong *)((long)register0x00000020 + -0xf0) =
           CONCAT17(s_features.multi_memory_enabled_,s_features._8_7_);
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d962;
      RVar8 = wabt::ValidateModule
                        (*(Module **)((long)register0x00000020 + -0x120),
                         (Errors *)((long)register0x00000020 + -0x118),options);
      if (RVar8.enum_ != Ok) goto LAB_0011db0c;
    }
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d97e;
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)((long)register0x00000020 + -0xf8),
               (Stream *)
               s_log_stream._M_t.
               super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
               super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
               super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    s_write_binary_options.features.custom_page_sizes_enabled_ =
         s_features.custom_page_sizes_enabled_;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d9ac;
    RVar8 = wabt::WriteBinaryModule
                      ((Stream *)((long)register0x00000020 + -0xf8),
                       *(Module **)((long)register0x00000020 + -0x120),&s_write_binary_options);
    pcVar7 = s_infile;
    if (RVar8.enum_ == Ok) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d9cf;
        pwVar9 = (wabt *)strlen(s_infile);
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d9da;
        filename._M_str = extraout_RDX;
        filename._M_len = (size_t)pcVar7;
        sVar13 = wabt::GetBasename(pwVar9,filename);
        filename_00._M_str = sVar13._M_str;
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d9e5;
        filename_00._M_len = (size_t)filename_00._M_str;
        sVar13 = wabt::StripExtension((wabt *)sVar13._M_len,filename_00);
        psVar1 = (string *)((long)register0x00000020 + -0x148);
        *(size_type *)psVar1 = __rlen;
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11d9fe;
        std::__cxx11::string::_M_construct<char_const*>
                  (psVar1,sVar13._M_str,sVar13._M_str + sVar13._M_len);
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da10;
        std::__cxx11::string::append((char *)psVar1);
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da1f;
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,psVar1);
        if (*(undefined8 **)psVar1 != (undefined8 *)__rlen) {
          *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da34;
          operator_delete(*(undefined8 **)psVar1,*(long *)((long)register0x00000020 + -0x138) + 1);
        }
      }
      _Var6._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da43;
      sVar10 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
      this = *(OutputBuffer **)((long)register0x00000020 + -0xd8);
      if (s_dump_module == '\x01') {
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da61;
        wabt::FileStream::CreateStdout();
        if (s_verbose != 0) {
          *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11da7d;
          wabt::Stream::Writef(*(Stream **)((long)register0x00000020 + -0x148),";; dump\n");
        }
        start = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (start != puVar2) {
          *(undefined8 *)((long)register0x00000020 + -0x158) = 0;
          *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11daa6;
          wabt::Stream::WriteMemoryDump
                    (*(Stream **)((long)register0x00000020 + -0x148),start,
                     (long)puVar2 - (long)start,0,No,(char *)0x0,
                     *(char **)((long)register0x00000020 + -0x158));
        }
        if (*(long **)((long)register0x00000020 + -0x148) != (long *)0x0) {
          pcVar3 = *(code **)(**(long **)((long)register0x00000020 + -0x148) + 8);
          *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11dab6;
          (*pcVar3)();
        }
      }
      if ((sVar10 == 1) && (*_Var6._M_p == '-')) {
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11daca;
        wabt::OutputBuffer::WriteToStdout(this);
      }
      else {
        *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11dada;
        filename_01._M_str = _Var6._M_p;
        filename_01._M_len = sVar10;
        wabt::OutputBuffer::WriteToFile(this,filename_01);
      }
    }
    *(undefined ***)((long)register0x00000020 + -0xf8) = &PTR__MemoryStream_0019fdf8;
    if (*(OutputBuffer **)((long)register0x00000020 + -0xd8) != (OutputBuffer *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db04;
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)((long)register0x00000020 + -0xd8),
                 *(OutputBuffer **)((long)register0x00000020 + -0xd8));
    }
    uVar11 = (uint)(RVar8.enum_ != Ok);
  }
LAB_0011db0c:
  *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db1e;
  wabt::WastLexer::MakeLineFinder((WastLexer *)((long)register0x00000020 + -0x148));
  line_finder._M_head_impl =
       (((WastLexer *)((long)register0x00000020 + -0x148))->source_)._M_t.
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  header = (string *)((long)register0x00000020 + -0xf8);
  (header->_M_dataplus)._M_p = unaff_R13;
  *(undefined8 *)((long)register0x00000020 + -0xf0) = 0;
  *(undefined1 *)((long)register0x00000020 + -0xe8) = 0;
  *(undefined4 *)((long)register0x00000020 + -0x158) = 0x50;
  *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db58;
  wabt::FormatErrorsToFile
            ((Errors *)((long)register0x00000020 + -0x118),Text,
             (LexerSourceLineFinder *)line_finder._M_head_impl,_stderr,header,Never,
             *(int *)((long)register0x00000020 + -0x158));
  pcVar4 = (header->_M_dataplus)._M_p;
  if (pcVar4 != unaff_R13) {
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db6d;
    operator_delete(pcVar4,*(long *)((long)register0x00000020 + -0xe8) + 1);
  }
  if (*(LexerSourceLineFinder **)((long)register0x00000020 + -0x148) != (LexerSourceLineFinder *)0x0
     ) {
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db81;
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)((long)register0x00000020 + -0x148),
               *(LexerSourceLineFinder **)((long)register0x00000020 + -0x148));
  }
  *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db8b;
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
             ((long)register0x00000020 + -0x120));
  if (*(WastLexer **)((long)register0x00000020 + -0x128) != (WastLexer *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11db9f;
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)((long)register0x00000020 + -0x128),
               *(WastLexer **)((long)register0x00000020 + -0x128));
  }
  *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11dba9;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             ((long)register0x00000020 + -0x118));
  pvVar5 = *(void **)((long)register0x00000020 + -0x68);
  if (pvVar5 != (void *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0x11dbc6;
    operator_delete(pvVar5,*(long *)((long)register0x00000020 + -0x58) - (long)pvVar5);
  }
  return uVar11;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}